

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O0

void __thiscall
cfd::core::Secp256k1::RangeProofInfoSecp256k1
          (Secp256k1 *this,ByteData *range_proof,int *exponent,int *mantissa,uint64_t *min_value,
          uint64_t *max_value)

{
  void *pvVar1;
  secp256k1_context *psVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  int *piVar5;
  CfdException *pCVar6;
  size_t sVar7;
  uchar *puVar8;
  size_type sVar9;
  allocator local_129;
  string local_128;
  CfdSourceLocation local_108;
  int local_ec;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> range_proof_bytes;
  string local_c8;
  CfdSourceLocation local_a8;
  undefined1 local_8d;
  allocator local_79;
  string local_78;
  CfdSourceLocation local_58;
  void *local_40;
  secp256k1_context *context;
  uint64_t *max_value_local;
  uint64_t *min_value_local;
  int *mantissa_local;
  int *exponent_local;
  ByteData *range_proof_local;
  Secp256k1 *this_local;
  
  local_40 = this->secp256k1_context_;
  context = (secp256k1_context *)max_value;
  max_value_local = min_value;
  min_value_local = (uint64_t *)mantissa;
  mantissa_local = exponent;
  exponent_local = (int *)range_proof;
  range_proof_local = (ByteData *)this;
  if (this->secp256k1_context_ == (void *)0x0) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x1d9;
    local_58.funcname = "RangeProofInfoSecp256k1";
    logger::warn<>(&local_58,"Secp256k1 context is NULL.");
    local_8d = 1;
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_78,"Secp256k1 context is NULL.",&local_79);
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_78);
    local_8d = 0;
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar7 = ByteData::GetDataSize(range_proof);
  if (sVar7 == 0) {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x1de;
    local_a8.funcname = "RangeProofInfoSecp256k1";
    logger::warn<>(&local_a8,"Secp256k1 range proof is empty.");
    range_proof_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_c8,"Secp256k1 empty range proof Error.",
               (allocator *)
               ((long)&range_proof_bytes.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_c8);
    range_proof_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8,
                     (ByteData *)exponent_local);
  piVar5 = mantissa_local;
  puVar4 = min_value_local;
  puVar3 = max_value_local;
  psVar2 = context;
  pvVar1 = local_40;
  puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_e8);
  sVar9 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_e8);
  local_ec = secp256k1_rangeproof_info(pvVar1,piVar5,puVar4,puVar3,psVar2,puVar8,sVar9);
  if (local_ec != 1) {
    local_108.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_secp256k1.cpp"
                 ,0x2f);
    local_108.filename = local_108.filename + 1;
    local_108.line = 0x1e9;
    local_108.funcname = "RangeProofInfoSecp256k1";
    logger::warn<int&>(&local_108,"secp256k1_rangeproof_info Error.({})",&local_ec);
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_128,"Secp256k1 decode range proof info Error.",&local_129);
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_128);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_e8);
  return;
}

Assistant:

void Secp256k1::RangeProofInfoSecp256k1(
    const ByteData& range_proof, int* exponent, int* mantissa,
    uint64_t* min_value, uint64_t* max_value) {
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);
  if (secp256k1_context_ == nullptr) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }
  if (!range_proof.GetDataSize()) {
    warn(CFD_LOG_SOURCE, "Secp256k1 range proof is empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 empty range proof Error.");
  }

  std::vector<uint8_t> range_proof_bytes = range_proof.GetBytes();
  int ret = secp256k1_rangeproof_info(
      context, exponent, mantissa, min_value, max_value,
      range_proof_bytes.data(), range_proof_bytes.size());
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_rangeproof_info Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 decode range proof info Error.");
  }
}